

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O0

int main(void)

{
  LogLevel LVar1;
  LogStream *pLVar2;
  EventLoop *this;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  TimerId TVar3;
  undefined1 local_3518 [12];
  Logger local_3508;
  int local_2534;
  duration<long,_std::ratio<1L,_1L>_> local_2530;
  TimerId local_2528;
  TimerCallback local_2518;
  EventLoop *local_24f8;
  EventLoop *loop_1;
  function<void_(sznet::net::EventLoop_*)> local_24d0;
  undefined1 local_24b0 [8];
  EventLoopThread loopThread;
  duration<long,std::ratio<1l,1l>> local_2340 [8];
  undefined1 local_2338 [12];
  Logger local_2328;
  TimerId local_1358;
  type local_1348;
  TimerCallback local_1330;
  _Bind<void_(*(const_char_*))(const_char_*)> local_1310;
  TimerCallback local_1300;
  undefined1 local_12e0 [8];
  TimerId t3;
  type local_12c0;
  TimerCallback local_12a8;
  TimerId local_1288;
  type local_1278;
  TimerCallback local_1260;
  _Bind<void_(*(const_char_*))(const_char_*)> local_1240;
  TimerCallback local_1230;
  undefined1 local_1210 [8];
  TimerId t45;
  _Bind<void_(*(const_char_*))(const_char_*)> local_11f0;
  TimerCallback local_11e0;
  TimerId local_11c0;
  _Bind<void_(*(const_char_*))(const_char_*)> local_11b0;
  TimerCallback local_11a0;
  TimerId local_1180;
  _Bind<void_(*(const_char_*))(const_char_*)> local_1170;
  TimerCallback local_1160;
  TimerId local_1140;
  _Bind<void_(*(const_char_*))(const_char_*)> local_1130;
  TimerCallback local_1120;
  TimerId local_1100;
  _Bind<void_(*(const_char_*))(const_char_*)> local_10f0;
  TimerCallback local_10e0;
  undefined1 local_10c0 [12];
  Logger local_10b0;
  undefined1 local_d0 [8];
  EventLoop loop;
  duration<long,std::ratio<1l,1l>> local_18 [12];
  undefined4 local_c;
  
  local_c = 0;
  printid();
  loop.m_pendingFunctors.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            (local_18,(int *)((long)&loop.m_pendingFunctors.
                                     super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)local_18);
  sznet::net::EventLoop::EventLoop((EventLoop *)local_d0);
  g_timequeue_loop = (EventLoop *)local_d0;
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_10c0,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_10c0._0_8_;
    file.m_size = local_10c0._8_4_;
    sznet::Logger::Logger(&local_10b0,file,0x32);
    pLVar2 = sznet::Logger::stream(&local_10b0);
    sznet::LogStream::operator<<(pLVar2,"main");
    sznet::Logger::~Logger(&local_10b0);
  }
  std::bind<void(&)(char_const*),char_const(&)[6]>
            ((_func_void_char_ptr *)&local_10f0,(char (*) [6])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_10e0,&local_10f0);
  local_1100 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,1.0,&local_10e0);
  std::function<void_()>::~function(&local_10e0);
  std::bind<void(&)(char_const*),char_const(&)[8]>
            ((_func_void_char_ptr *)&local_1130,(char (*) [8])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_1120,&local_1130);
  local_1140 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,1.5,&local_1120);
  std::function<void_()>::~function(&local_1120);
  std::bind<void(&)(char_const*),char_const(&)[7]>
            ((_func_void_char_ptr *)&local_1170,(char (*) [7])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_1160,&local_1170);
  local_1180 = sznet::net::EventLoop::runEvery((EventLoop *)local_d0,2.0,&local_1160);
  std::function<void_()>::~function(&local_1160);
  std::bind<void(&)(char_const*),char_const(&)[8]>
            ((_func_void_char_ptr *)&local_11b0,(char (*) [8])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_11a0,&local_11b0);
  local_11c0 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,2.5,&local_11a0);
  std::function<void_()>::~function(&local_11a0);
  std::bind<void(&)(char_const*),char_const(&)[8]>
            ((_func_void_char_ptr *)&local_11f0,(char (*) [8])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_11e0,&local_11f0);
  TVar3 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,3.5,&local_11e0);
  t45.m_sequence = (int64_t)TVar3.m_timer;
  std::function<void_()>::~function(&local_11e0);
  std::bind<void(&)(char_const*),char_const(&)[8]>
            ((_func_void_char_ptr *)&local_1240,(char (*) [8])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_1230,&local_1240);
  TVar3 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,4.5,&local_1230);
  t45.m_timer = (Timer *)TVar3.m_sequence;
  local_1210 = (undefined1  [8])TVar3.m_timer;
  std::function<void_()>::~function(&local_1230);
  std::bind<void(&)(sznet::TimerId),sznet::TimerId&>(&local_1278,cancel,(TimerId *)local_1210);
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_1260,&local_1278);
  local_1288 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,4.2,&local_1260);
  std::function<void_()>::~function(&local_1260);
  std::bind<void(&)(sznet::TimerId),sznet::TimerId&>(&local_12c0,cancel,(TimerId *)local_1210);
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_12a8,&local_12c0);
  TVar3 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,4.8,&local_12a8);
  t3.m_sequence = (int64_t)TVar3.m_timer;
  std::function<void_()>::~function(&local_12a8);
  std::bind<void(&)(char_const*),char_const(&)[7]>
            ((_func_void_char_ptr *)&local_1310,(char (*) [7])print);
  std::function<void()>::function<std::_Bind<void(*(char_const*))(char_const*)>,void>
            ((function<void()> *)&local_1300,&local_1310);
  TVar3 = sznet::net::EventLoop::runEvery((EventLoop *)local_d0,3.0,&local_1300);
  t3.m_timer = (Timer *)TVar3.m_sequence;
  local_12e0 = (undefined1  [8])TVar3.m_timer;
  std::function<void_()>::~function(&local_1300);
  std::bind<void(&)(sznet::TimerId),sznet::TimerId&>(&local_1348,cancel,(TimerId *)local_12e0);
  std::function<void()>::function<std::_Bind<void(*(sznet::TimerId))(sznet::TimerId)>,void>
            ((function<void()> *)&local_1330,&local_1348);
  local_1358 = sznet::net::EventLoop::runAfter((EventLoop *)local_d0,9.001,&local_1330);
  std::function<void_()>::~function(&local_1330);
  sznet::net::EventLoop::loop((EventLoop *)local_d0);
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_2338,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_2338._0_8_;
    file_00.m_size = local_2338._8_4_;
    sznet::Logger::Logger(&local_2328,file_00,0x40);
    pLVar2 = sznet::Logger::stream(&local_2328);
    sznet::LogStream::operator<<(pLVar2,"main loop exits");
    sznet::Logger::~Logger(&local_2328);
  }
  sznet::net::EventLoop::~EventLoop((EventLoop *)local_d0);
  loopThread.m_callback._M_invoker._4_4_ = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            (local_2340,(int *)((long)&loopThread.m_callback._M_invoker + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)local_2340);
  std::function<void_(sznet::net::EventLoop_*)>::function(&local_24d0);
  std::__cxx11::string::string((string *)&loop_1);
  sznet::net::EventLoopThread::EventLoopThread
            ((EventLoopThread *)local_24b0,&local_24d0,(string *)&loop_1);
  std::__cxx11::string::~string((string *)&loop_1);
  std::function<void_(sznet::net::EventLoop_*)>::~function(&local_24d0);
  this = sznet::net::EventLoopThread::startLoop((EventLoopThread *)local_24b0);
  local_24f8 = this;
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_2518,printid);
  local_2528 = sznet::net::EventLoop::runAfter(this,2.0,&local_2518);
  std::function<void_()>::~function(&local_2518);
  local_2534 = 3;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_2530,&local_2534);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2530);
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_3518,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)local_3518._0_8_;
    file_01.m_size = local_3518._8_4_;
    sznet::Logger::Logger(&local_3508,file_01,0x48);
    pLVar2 = sznet::Logger::stream(&local_3508);
    sznet::LogStream::operator<<(pLVar2,"thread loop exits");
    sznet::Logger::~Logger(&local_3508);
  }
  sznet::net::EventLoopThread::~EventLoopThread((EventLoopThread *)local_24b0);
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	printid();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoop loop;
		g_timequeue_loop = &loop;

		LOG_INFO << "main";
		loop.runAfter(1, std::bind(print, "once1"));
		loop.runAfter(1.5, std::bind(print, "once1.5"));
		loop.runEvery(2, std::bind(print, "every2"));
		loop.runAfter(2.5, std::bind(print, "once2.5"));
		loop.runAfter(3.5, std::bind(print, "once3.5"));

		TimerId t45 = loop.runAfter(4.5, std::bind(print, "once4.5"));
		loop.runAfter(4.2, std::bind(cancel, t45));
		loop.runAfter(4.8, std::bind(cancel, t45));
		TimerId t3 = loop.runEvery(3, std::bind(print, "every3"));
		loop.runAfter(9.001, std::bind(cancel, t3));

		loop.loop();
		LOG_INFO << "main loop exits";
	}
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoopThread loopThread;
		EventLoop* loop = loopThread.startLoop();
		loop->runAfter(2, printid);
		std::this_thread::sleep_for(std::chrono::seconds(3));
		LOG_INFO << "thread loop exits";
	}
	std::cin.get();
	return 0;
}